

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void flatbuffers::ForAllFields
               (Object *object,bool reverse,function<void_(const_reflection::Field_*)> *func)

{
  uint16_t uVar1;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar2;
  return_type pFVar3;
  ulong uVar4;
  size_t i_1;
  ulong uVar5;
  uint32_t i;
  uint i_00;
  long lVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> field_to_id_map;
  
  field_to_id_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  field_to_id_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  field_to_id_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar2 = reflection::Object::fields(object);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&field_to_id_map,(ulong)*(uint *)pVVar2);
  i_00 = 0;
  while( true ) {
    pVVar2 = reflection::Object::fields(object);
    if (*(uint *)pVVar2 <= i_00) break;
    pVVar2 = reflection::Object::fields(object);
    pFVar3 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get(pVVar2,i_00);
    uVar1 = reflection::Field::id(pFVar3);
    field_to_id_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar1] = i_00;
    i_00 = i_00 + 1;
  }
  lVar6 = 1;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)field_to_id_map.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)field_to_id_map.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    pVVar2 = reflection::Object::fields(object);
    uVar4 = uVar5;
    if (reverse) {
      uVar4 = ((long)field_to_id_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)field_to_id_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) + lVar6;
    }
    pFVar3 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get
                       (pVVar2,field_to_id_map.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::function<void_(const_reflection::Field_*)>::operator()(func,pFVar3);
    lVar6 = lVar6 + -1;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&field_to_id_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void ForAllFields(const reflection::Object *object, bool reverse,
                  std::function<void(const reflection::Field *)> func) {
  std::vector<uint32_t> field_to_id_map;
  field_to_id_map.resize(object->fields()->size());

  // Create the mapping of field ID to the index into the vector.
  for (uint32_t i = 0; i < object->fields()->size(); ++i) {
    auto field = object->fields()->Get(i);
    field_to_id_map[field->id()] = i;
  }

  for (size_t i = 0; i < field_to_id_map.size(); ++i) {
    func(object->fields()->Get(
        field_to_id_map[reverse ? field_to_id_map.size() - i + 1 : i]));
  }
}